

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

char __thiscall
loltoml::v_0_1_1::detail::parser_t<events_aggregator_t>::parse_datetime_digit
          (parser_t<events_aggregator_t> *this)

{
  size_t sVar1;
  char cVar2;
  undefined8 *puVar3;
  long lVar4;
  uint *local_38;
  undefined8 local_30;
  uint local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  cVar2 = input_stream_t::get(&this->input);
  if ((int)cVar2 - 0x30U < 10) {
    return cVar2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Bad datetime. Expected digit.","");
  sVar1 = (this->input).m_processed;
  lVar4 = 0;
  if (sVar1 != 0) {
    lVar4 = sVar1 - 1;
  }
  *puVar3 = &PTR__parser_error_t_001af398;
  puVar3[1] = puVar3 + 3;
  if (local_38 == &local_28) {
    *(uint *)(puVar3 + 3) = local_28;
    *(undefined4 *)((long)puVar3 + 0x1c) = uStack_24;
    *(undefined4 *)(puVar3 + 4) = uStack_20;
    *(undefined4 *)((long)puVar3 + 0x24) = uStack_1c;
  }
  else {
    puVar3[1] = local_38;
    puVar3[3] = CONCAT44(uStack_24,local_28);
  }
  puVar3[2] = local_30;
  local_30 = 0;
  local_28 = local_28 & 0xffffff00;
  puVar3[5] = lVar4;
  local_38 = &local_28;
  __cxa_throw(puVar3,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
}

Assistant:

char parse_datetime_digit() {
        char ch = input.get();
        if (std::isdigit(ch)) {
            return ch;
        } else {
            throw parser_error_t("Bad datetime. Expected digit.", last_char_offset());
        }
    }